

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * getLinkedTargetsContent<cmLinkImplItem>
                   (string *__return_storage_ptr__,
                   vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *libraries,
                   cmGeneratorTarget *target,cmGeneratorTarget *headTarget,
                   cmGeneratorExpressionContext *context,cmGeneratorExpressionDAGChecker *dagChecker
                   ,string *interfacePropertyName)

{
  bool bVar1;
  pointer pcVar2;
  string *__rhs;
  ulong uVar3;
  cmLocalGenerator *lg;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  local_90;
  __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  local_88;
  const_iterator it;
  string depString;
  string sep;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  cmGeneratorExpressionContext *context_local;
  cmGeneratorTarget *headTarget_local;
  cmGeneratorTarget *target_local;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *libraries_local;
  string *linkedTargetsContent;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)(depString.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&it);
  local_88._M_current =
       (cmLinkImplItem *)
       std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin(libraries);
  while( true ) {
    local_90._M_current =
         (cmLinkImplItem *)
         std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end(libraries);
    bVar1 = __gnu_cxx::operator!=(&local_88,&local_90);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
             ::operator->(&local_88);
    if (((pcVar2->super_cmLinkItem).Target != (cmGeneratorTarget *)0x0) &&
       (pcVar2 = __gnu_cxx::
                 __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                 ::operator->(&local_88), (pcVar2->super_cmLinkItem).Target != target)) {
      std::operator+(&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&depString.field_2 + 8),"$<TARGET_PROPERTY:");
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
               ::operator->(&local_88);
      __rhs = cmGeneratorTarget::GetName_abi_cxx11_((pcVar2->super_cmLinkItem).Target);
      std::operator+(&local_110,&local_130,__rhs);
      std::operator+(&local_f0,&local_110,",");
      std::operator+(&local_d0,&local_f0,interfacePropertyName);
      std::operator+(&local_b0,&local_d0,">");
      std::__cxx11::string::operator+=((string *)&it,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::operator=((string *)(depString.field_2._M_local_buf + 8),";");
    }
    __gnu_cxx::
    __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
    ::operator++(&local_88);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    lg = cmGeneratorTarget::GetLocalGenerator(target);
    cmGeneratorExpressionNode::EvaluateDependentExpression
              (&local_160,(string *)&it,lg,context,headTarget,target,dagChecker);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_160);
    std::__cxx11::string::~string((string *)&local_160);
  }
  cmGeneratorExpression::StripEmptyListElements(&local_180,__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&it);
  std::__cxx11::string::~string((string *)(depString.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string getLinkedTargetsContent(
  std::vector<T> const& libraries, cmGeneratorTarget const* target,
  cmGeneratorTarget const* headTarget, cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker,
  const std::string& interfacePropertyName)
{
  std::string linkedTargetsContent;
  std::string sep;
  std::string depString;
  for (typename std::vector<T>::const_iterator it = libraries.begin();
       it != libraries.end(); ++it) {
    // Broken code can have a target in its own link interface.
    // Don't follow such link interface entries so as not to create a
    // self-referencing loop.
    if (it->Target && it->Target != target) {
      depString += sep + "$<TARGET_PROPERTY:" + it->Target->GetName() + "," +
        interfacePropertyName + ">";
      sep = ";";
    }
  }
  if (!depString.empty()) {
    linkedTargetsContent =
      cmGeneratorExpressionNode::EvaluateDependentExpression(
        depString, target->GetLocalGenerator(), context, headTarget, target,
        dagChecker);
  }
  linkedTargetsContent =
    cmGeneratorExpression::StripEmptyListElements(linkedTargetsContent);
  return linkedTargetsContent;
}